

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  ImVector<ImGuiViewportP_*> *this;
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  ImVec2 IVar7;
  ImGuiViewportP *viewport;
  undefined1 auVar8 [12];
  ImGuiContext *ctx;
  ImGuiContext *pIVar9;
  char cVar10;
  bool bVar11;
  ImU32 IVar12;
  ImGuiViewportP **ppIVar13;
  ImDrawList *pIVar14;
  ImGuiWindow **ppIVar15;
  ImGuiWindow *pIVar16;
  ImVec2 *pIVar17;
  ImGuiIO *pIVar18;
  ImGuiWindow *pIVar19;
  ImVec2 IVar20;
  int n;
  int iVar21;
  ImGuiWindow *pIVar22;
  int n_2;
  int iVar23;
  ImGuiCol idx;
  long lVar24;
  ImGuiViewportP *pIVar25;
  ImVec2 IVar26;
  undefined1 auVar27 [16];
  ImVec2 IVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  ImRect IVar32;
  ImGuiViewportP *local_70;
  ImVec2 local_58;
  ImVec2 IStack_50;
  ImGuiWindow *windows_to_render_top_most [2];
  
  ctx = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x140e,"void ImGui::Render()");
  }
  iVar23 = GImGui->FrameCountEnded;
  if (iVar23 != GImGui->FrameCount) {
    EndFrame();
    iVar23 = ctx->FrameCount;
  }
  iVar5 = ctx->FrameCountRendered;
  ctx->FrameCountRendered = iVar23;
  (ctx->IO).MetricsRenderWindows = 0;
  CallContextHooks(ctx,ImGuiContextHookType_RenderPre);
  this = &ctx->Viewports;
  for (iVar21 = 0; iVar21 != this->Size; iVar21 = iVar21 + 1) {
    ppIVar13 = ImVector<ImGuiViewportP_*>::operator[](this,iVar21);
    pIVar25 = *ppIVar13;
    ImDrawDataBuilder::Clear(&pIVar25->DrawDataBuilder);
    if (pIVar25->DrawLists[0] != (ImDrawList *)0x0) {
      pIVar14 = GetBackgroundDrawList(&pIVar25->super_ImGuiViewport);
      AddDrawListToDrawData((pIVar25->DrawDataBuilder).Layers,pIVar14);
    }
  }
  pIVar16 = ctx->NavWindowingTarget;
  if (pIVar16 == (ImGuiWindow *)0x0) {
    windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    pIVar16 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar16->Flags & 0x2000) == 0) {
      windows_to_render_top_most[0] = pIVar16->RootWindowDockTree;
    }
    else {
      windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    }
    pIVar16 = ctx->NavWindowingListWindow;
  }
  pIVar19 = windows_to_render_top_most[0];
  windows_to_render_top_most[1] = pIVar16;
  for (iVar21 = 0; iVar21 != (ctx->Windows).Size; iVar21 = iVar21 + 1) {
    ppIVar15 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,iVar21);
    pIVar22 = *ppIVar15;
    if (((pIVar22->Active == true) && (pIVar22->Hidden == false)) &&
       ((pIVar22 != pIVar16 && pIVar22 != pIVar19) && (pIVar22->Flags & 0x1000000) == 0)) {
      AddRootWindowToDrawData(pIVar22);
    }
  }
  for (lVar24 = 0; pIVar9 = GImGui, lVar24 != 2; lVar24 = lVar24 + 1) {
    pIVar16 = windows_to_render_top_most[lVar24];
    if (((pIVar16 != (ImGuiWindow *)0x0) && (pIVar16->Active == true)) && (pIVar16->Hidden == false)
       ) {
      AddRootWindowToDrawData(pIVar16);
    }
  }
  if (iVar5 == iVar23) goto LAB_0014ec4a;
  pIVar16 = GetTopMostAndVisiblePopupModal();
  if ((0.0 < pIVar9->DimBgRatio) || (0.0 < pIVar9->NavWindowingHighlightAlpha)) {
    pIVar19 = pIVar9->NavWindowingTargetAnim;
    if (pIVar19 == (ImGuiWindow *)0x0) {
      cVar10 = '\0';
    }
    else {
      cVar10 = pIVar19->Active;
    }
    if ((pIVar16 != (ImGuiWindow *)0x0) || (cVar10 != '\0')) {
      if (pIVar16 == (ImGuiWindow *)0x0) {
        if (cVar10 == '\0') {
          local_70 = (ImGuiViewportP *)0x0;
          pIVar25 = (ImGuiViewportP *)0x0;
        }
        else {
          IVar12 = GetColorU32(0x35,pIVar9->DimBgRatio);
          RenderDimmedBackgroundBehindWindow(pIVar19,IVar12);
          pIVar19 = pIVar9->NavWindowingListWindow;
          if (pIVar19 == (ImGuiWindow *)0x0) {
            pIVar22 = pIVar9->NavWindowingTargetAnim;
            pIVar25 = pIVar22->Viewport;
LAB_0014ee89:
            local_70 = (ImGuiViewportP *)0x0;
          }
          else {
            local_70 = pIVar19->Viewport;
            pIVar22 = pIVar9->NavWindowingTargetAnim;
            pIVar25 = pIVar22->Viewport;
            if (local_70 == (ImGuiViewportP *)0x0) goto LAB_0014ee89;
            if (local_70 != pIVar25) {
              IVar12 = GetColorU32(0x35,pIVar9->DimBgRatio);
              RenderDimmedBackgroundBehindWindow(pIVar19,IVar12);
              pIVar22 = pIVar9->NavWindowingTargetAnim;
              pIVar25 = pIVar22->Viewport;
              if (pIVar9->NavWindowingListWindow == (ImGuiWindow *)0x0) goto LAB_0014ee89;
              local_70 = pIVar9->NavWindowingListWindow->Viewport;
            }
          }
          fVar29 = pIVar9->FontSize;
          IVar32 = ImGuiWindow::Rect(pIVar22);
          local_58.x = IVar32.Min.x - fVar29;
          local_58.y = IVar32.Min.y - fVar29;
          fVar30 = fVar29 + IVar32.Max.x;
          fVar31 = fVar29 + IVar32.Max.y;
          auVar8._4_4_ = IVar32.Max.x;
          auVar8._8_4_ = IVar32.Max.y;
          auVar8._0_4_ = fVar29 + IVar32.Min.y;
          auVar27._0_8_ = auVar8._0_8_ << 0x20;
          auVar27._8_4_ = fVar30;
          auVar27._12_4_ = fVar31;
          IStack_50 = auVar27._8_8_;
          fVar1 = (pIVar25->super_ImGuiViewport).Size.x;
          if ((fVar1 <= fVar30 - local_58.x) &&
             ((pIVar25->super_ImGuiViewport).Size.y <= fVar31 - local_58.y)) {
            fVar29 = -1.0 - fVar29;
            local_58.y = local_58.y - fVar29;
            local_58.x = local_58.x - fVar29;
            IStack_50.y = fVar29 + fVar31;
            IStack_50.x = fVar29 + fVar30;
          }
          pIVar14 = pIVar22->DrawList;
          if ((pIVar14->CmdBuffer).Size == 0) {
            ImDrawList::AddDrawCmd(pIVar14);
            pIVar14 = pIVar22->DrawList;
            fVar1 = (pIVar25->super_ImGuiViewport).Size.x;
          }
          IVar7 = (pIVar25->super_ImGuiViewport).Pos;
          IVar28.x = fVar1 + IVar7.x;
          IVar28.y = (pIVar25->super_ImGuiViewport).Size.y + IVar7.y;
          ImDrawList::PushClipRect(pIVar14,IVar7,IVar28,false);
          pIVar14 = pIVar22->DrawList;
          IVar12 = GetColorU32(0x34,pIVar9->NavWindowingHighlightAlpha);
          ImDrawList::AddRect(pIVar14,&local_58,&IStack_50,IVar12,pIVar22->WindowRounding,0,3.0);
          ImDrawList::PopClipRect(pIVar22->DrawList);
        }
      }
      else {
        pIVar19 = FindBottomMostVisibleWindowWithinBeginStack(pIVar16);
        IVar12 = GetColorU32(0x36,pIVar9->DimBgRatio);
        RenderDimmedBackgroundBehindWindow(pIVar19,IVar12);
        pIVar25 = pIVar16->Viewport;
        local_70 = (ImGuiViewportP *)0x0;
      }
      for (iVar23 = 0; iVar23 < (pIVar9->Viewports).Size; iVar23 = iVar23 + 1) {
        ppIVar13 = ImVector<ImGuiViewportP_*>::operator[](&pIVar9->Viewports,iVar23);
        viewport = *ppIVar13;
        if ((viewport != pIVar25) && (viewport != local_70)) {
          idx = 0x35;
          if (pIVar16 != (ImGuiWindow *)0x0) {
            idx = 0x36;
            if (viewport->Window != (ImGuiWindow *)0x0) {
              bVar11 = IsWindowAbove(viewport->Window,pIVar16);
              idx = 0x36;
              if (bVar11) goto LAB_0014f05c;
            }
          }
          pIVar14 = GetForegroundDrawList(&viewport->super_ImGuiViewport);
          IVar12 = GetColorU32(idx,pIVar9->DimBgRatio);
          IVar7 = (viewport->super_ImGuiViewport).Pos;
          IVar28 = (viewport->super_ImGuiViewport).Size;
          local_58.x = IVar28.x + IVar7.x;
          local_58.y = IVar28.y + IVar7.y;
          ImDrawList::AddRectFilled
                    (pIVar14,&(viewport->super_ImGuiViewport).Pos,&local_58,IVar12,0.0,0);
        }
LAB_0014f05c:
      }
    }
  }
  if (((ctx->IO).MouseDrawCursor == true) && (ctx->MouseCursor != -1)) {
    RenderMouseCursor((ctx->IO).MousePos,(ctx->Style).MouseCursorScale,ctx->MouseCursor,0xffffffff,
                      0xff000000,0x30000000);
  }
LAB_0014ec4a:
  (ctx->IO).MetricsRenderVertices = 0;
  (ctx->IO).MetricsRenderIndices = 0;
  for (iVar23 = 0; iVar23 < this->Size; iVar23 = iVar23 + 1) {
    pIVar17 = (ImVec2 *)ImVector<ImGuiViewportP_*>::operator[](this,iVar23);
    IVar7 = *pIVar17;
    ImDrawDataBuilder::FlattenIntoSingleLayer((ImDrawDataBuilder *)((long)IVar7 + 0xd8));
    if (*(void **)((long)IVar7 + 0x98) != (void *)0x0) {
      pIVar14 = GetForegroundDrawList((ImGuiViewport *)IVar7);
      AddDrawListToDrawData((ImVector<ImDrawList_*> *)((long)IVar7 + 0xd8),pIVar14);
    }
    uVar6 = *(ImGuiViewportFlags *)((long)IVar7 + 4);
    pIVar18 = GetIO();
    *(ImDrawData **)((long)IVar7 + 0x30) = (ImDrawData *)((long)IVar7 + 0xa0);
    *(undefined1 *)((long)IVar7 + 0xa0) = 1;
    fVar29 = ((ImVec2 *)((long)IVar7 + 0xd8))->x;
    if ((int)fVar29 < 1) {
      IVar20.x = 0.0;
      IVar20.y = 0.0;
    }
    else {
      IVar20 = *(ImVec2 *)((long)IVar7 + 0xe0);
    }
    *(void **)((long)IVar7 + 0xa8) = (void *)0x0;
    *(ImVec2 *)((long)IVar7 + 0xb0) = IVar20;
    *(float *)((long)IVar7 + 0xa4) = fVar29;
    *(ImVec2 *)((long)IVar7 + 0xb8) = *(ImVec2 *)((long)IVar7 + 8);
    IVar26.x = 0.0;
    IVar26.y = 0.0;
    if ((uVar6 >> 10 & 1) == 0) {
      IVar26 = *(ImVec2 *)((long)IVar7 + 0x10);
    }
    ((ImGuiViewport *)((long)IVar7 + 0xc0))->ID = (ImGuiID)IVar26.x;
    ((ImGuiViewport *)((long)IVar7 + 0xc0))->Flags = (ImGuiViewportFlags)IVar26.y;
    *(ImVec2 *)((long)IVar7 + 200) = pIVar18->DisplayFramebufferScale;
    *(ImVec2 *)((long)IVar7 + 0xd0) = IVar7;
    for (lVar24 = 0; lVar24 < (int)fVar29; lVar24 = lVar24 + 1) {
      pIVar14 = *(ImDrawList **)(*(long *)((long)IVar7 + 0xe0) + lVar24 * 8);
      ImDrawList::_PopUnusedDrawCmd(pIVar14);
      *(int *)((long)IVar7 + 0xac) = *(int *)((long)IVar7 + 0xac) + (pIVar14->VtxBuffer).Size;
      *(int *)((long)IVar7 + 0xa8) = *(int *)((long)IVar7 + 0xa8) + (pIVar14->IdxBuffer).Size;
      fVar29 = *(float *)((long)IVar7 + 0xd8);
    }
    uVar3 = *(undefined8 *)(*(long *)((long)IVar7 + 0x30) + 8);
    uVar2 = (ctx->IO).MetricsRenderVertices;
    uVar4 = (ctx->IO).MetricsRenderIndices;
    (ctx->IO).MetricsRenderVertices = uVar2 + (int)((ulong)uVar3 >> 0x20);
    (ctx->IO).MetricsRenderIndices = uVar4 + (int)uVar3;
  }
  CallContextHooks(ctx,ImGuiContextHookType_RenderPost);
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    const bool first_render_of_frame = (g.FrameCountRendered != g.FrameCount);
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindowDockTree : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw modal/window whitening backgrounds
    if (first_render_of_frame)
        RenderDimmedBackgrounds();

    // Draw software mouse cursor if requested by io.MouseDrawCursor flag
    if (g.IO.MouseDrawCursor && first_render_of_frame && g.MouseCursor != ImGuiMouseCursor_None)
        RenderMouseCursor(g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = viewport->DrawData;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}